

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O0

RPCHelpMan * wallet::sendall(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCArg> __l_01;
  initializer_list<RPCArg> __l_02;
  initializer_list<RPCArg> __l_03;
  initializer_list<RPCArg> __l_04;
  initializer_list<RPCResult> __l_05;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffbf58;
  allocator<RPCArg> *paVar2;
  vector<RPCResult,_std::allocator<RPCResult>_> *pvVar3;
  allocator<RPCResult> *this;
  RPCArg *this_00;
  UniValue *in_stack_ffffffffffffbf60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffbf68;
  undefined4 in_stack_ffffffffffffbf70;
  VType in_stack_ffffffffffffbf74;
  UniValue *in_stack_ffffffffffffbf78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffbf88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffbf90;
  UniValue *in_stack_ffffffffffffbf98;
  UniValue *in_stack_ffffffffffffbfa0;
  undefined7 in_stack_ffffffffffffbfa8;
  undefined1 in_stack_ffffffffffffbfaf;
  string *in_stack_ffffffffffffbfb0;
  undefined7 in_stack_ffffffffffffbfb8;
  undefined1 in_stack_ffffffffffffbfbf;
  undefined4 in_stack_ffffffffffffbfc0;
  Type in_stack_ffffffffffffbfc4;
  string *in_stack_ffffffffffffbfc8;
  undefined4 in_stack_ffffffffffffbfd0;
  Type in_stack_ffffffffffffbfd4;
  undefined4 in_stack_ffffffffffffbfd8;
  Type in_stack_ffffffffffffbfdc;
  RPCArg *in_stack_ffffffffffffbfe0;
  RPCArgOptions *opts;
  undefined1 *local_3f68;
  RPCExamples *in_stack_ffffffffffffc0a0;
  RPCResults *in_stack_ffffffffffffc0a8;
  undefined1 *puVar4;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_ffffffffffffc0b0;
  string *in_stack_ffffffffffffc0b8;
  string *in_stack_ffffffffffffc0c0;
  RPCHelpMan *in_stack_ffffffffffffc0c8;
  undefined1 *local_3f20;
  undefined1 *local_3f08;
  undefined1 *local_3ef0;
  undefined1 *local_3ed8;
  RPCMethodImpl *fun;
  undefined1 local_3ad0 [35];
  allocator<char> local_3aad;
  allocator<char> local_3aac;
  allocator<char> local_3aab;
  allocator<char> local_3aaa [2];
  pointer local_3aa8;
  pointer pRStack_3aa0;
  pointer local_3a98;
  allocator<char> local_3a8a;
  allocator<char> local_3a89 [31];
  allocator<char> local_3a6a;
  allocator<char> local_3a69 [31];
  allocator<char> local_3a4a;
  RPCMethodImpl local_3a49;
  allocator<char> local_3a22;
  allocator<char> local_3a21 [31];
  allocator<char> local_3a02;
  allocator<char> local_3a01 [32];
  allocator<char> local_39e1;
  vector<RPCArg,_std::allocator<RPCArg>_> local_39e0;
  allocator<char> local_39c5;
  undefined4 local_39c4;
  allocator<char> local_39be;
  allocator<char> local_39bd;
  undefined4 local_39bc;
  allocator<char> local_39b7;
  allocator<char> local_39b6;
  undefined1 local_39b5;
  allocator<char> local_39b4;
  allocator<char> local_39b3;
  allocator<char> local_39b2;
  allocator<char> local_39b1;
  allocator<char> local_39b0;
  undefined1 local_39af;
  allocator<char> local_39ae;
  allocator<char> local_39ad;
  undefined4 local_39ac;
  allocator<char> local_39a7 [3];
  allocator<char> local_39a4;
  allocator<char> local_39a3;
  allocator<char> local_39a2;
  allocator<char> local_39a1;
  undefined4 local_39a0;
  allocator<char> local_399a;
  allocator<char> local_3999;
  undefined4 local_3998;
  allocator<char> local_3991 [32];
  allocator<char> local_3971;
  undefined4 local_3970;
  allocator<char> local_3969 [31];
  allocator<char> local_394a;
  allocator<char> local_3949;
  allocator<char> local_3948;
  allocator<char> local_3947;
  allocator<char> local_3946;
  allocator<char> local_3945;
  allocator<char> local_3944;
  allocator<char> local_3943;
  undefined1 local_3942;
  allocator<char> local_3941 [56];
  allocator<char> local_3909;
  undefined4 local_3908;
  allocator<char> local_3902;
  allocator<char> local_3901;
  allocator<char> local_3900;
  allocator<char> local_38ff;
  allocator<char> local_38fe;
  allocator<char> local_38fd;
  allocator<char> local_38fc;
  allocator<char> local_38fb [3];
  undefined4 local_38f8;
  allocator<char> local_38f1 [32];
  allocator<char> local_38d1;
  undefined4 local_38d0;
  allocator<char> local_38ca;
  allocator<char> local_38c9;
  undefined4 local_38c8;
  allocator<char> local_38c1 [32];
  allocator<char> local_38a1;
  undefined4 local_38a0;
  allocator<char> local_3899 [31];
  allocator<char> local_387a;
  allocator<char> local_3879 [1729];
  undefined1 local_31b8 [440];
  undefined8 local_3000;
  undefined1 local_2f98 [200];
  allocator<RPCArg> local_2ed0 [40];
  undefined8 local_2ea8;
  undefined8 uStack_2ea0;
  undefined8 local_2e98;
  undefined1 local_2e90;
  undefined1 local_2e8f;
  undefined1 local_2e88;
  undefined8 local_2e60;
  undefined8 uStack_2e58;
  undefined8 local_2e50;
  undefined1 local_2e48;
  undefined1 local_2e47;
  undefined1 local_2da0;
  undefined8 local_2d78;
  undefined8 uStack_2d70;
  undefined8 local_2d68;
  undefined1 local_2d60;
  undefined1 local_2d5f;
  undefined1 local_2c60;
  undefined8 local_2c38;
  undefined8 uStack_2c30;
  undefined8 local_2c28;
  undefined1 local_2c20;
  undefined1 local_2c1f;
  undefined1 local_2b20;
  undefined8 local_2af8;
  undefined8 uStack_2af0;
  undefined8 local_2ae8;
  undefined1 local_2ae0;
  undefined1 local_2adf;
  undefined1 local_2a18;
  undefined8 local_29f0;
  undefined8 uStack_29e8;
  undefined8 local_29e0;
  undefined1 local_29d8;
  undefined1 local_29d7;
  undefined1 local_28d8;
  undefined8 local_28b0;
  undefined8 uStack_28a8;
  undefined8 local_28a0;
  undefined1 local_2898;
  undefined1 local_2897;
  allocator<RPCArg> local_2798 [40];
  undefined8 local_2770;
  undefined8 uStack_2768;
  undefined8 local_2760;
  undefined1 local_2758;
  undefined1 local_2757;
  allocator<RPCArg> local_2750 [40];
  undefined8 local_2728;
  undefined8 uStack_2720;
  undefined8 local_2718;
  undefined1 local_2710;
  undefined1 local_270f;
  undefined1 local_2708;
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 local_26d0;
  undefined1 local_26c8;
  undefined1 local_26c7;
  undefined1 local_2600;
  undefined8 local_25d8;
  undefined8 uStack_25d0;
  undefined8 local_25c8;
  undefined1 local_25c0;
  undefined1 local_25bf;
  undefined1 local_2518;
  undefined8 local_24f0;
  undefined8 uStack_24e8;
  undefined8 local_24e0;
  undefined1 local_24d8;
  undefined1 local_24d7;
  undefined1 local_2430 [792];
  undefined1 local_2118 [160];
  undefined1 local_2078 [120];
  undefined8 local_2000;
  undefined1 local_1f70 [280];
  undefined1 local_1e58;
  undefined8 local_1e30;
  undefined8 uStack_1e28;
  undefined8 local_1e20;
  undefined1 local_1e18;
  undefined1 local_1e17;
  undefined1 local_1d50;
  undefined8 local_1d28;
  undefined8 uStack_1d20;
  undefined8 local_1d18;
  undefined1 local_1d10;
  undefined1 local_1d0f;
  undefined1 local_1c28;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 local_1bf0;
  undefined1 local_1be8;
  undefined1 local_1be7;
  undefined1 local_1ae8 [2640];
  undefined1 local_1098 [152];
  undefined8 local_1000;
  undefined1 local_ff8;
  undefined8 local_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined1 local_fb8;
  undefined1 local_fb7;
  undefined1 local_ed0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined1 local_e90;
  undefined1 local_e8f;
  undefined1 local_d50;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined1 local_d10;
  undefined1 local_d0f;
  allocator<RPCArg> local_c48 [40];
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 local_c10;
  undefined1 local_c08;
  undefined1 local_c07;
  allocator<RPCArg> local_c00 [40];
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined1 local_bc0;
  undefined1 local_bbf;
  undefined1 local_bb8;
  undefined8 local_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined1 local_b78;
  undefined1 local_b77;
  undefined1 local_ab0 [264];
  undefined1 local_9a8 [160];
  undefined1 local_908;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 local_8d0;
  undefined1 local_8c8;
  undefined1 local_8c7;
  undefined1 local_820 [528];
  undefined1 local_610 [160];
  undefined1 local_570 [1320];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000 = 0;
  local_2000 = 0;
  local_3000 = 0;
  opts = (RPCArgOptions *)0x0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  local_38a0 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffbf68,&in_stack_ffffffffffffbf60->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  local_38c8 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffbf68,&in_stack_ffffffffffffbf60->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  local_908 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70));
  local_8e0 = 0;
  uStack_8d8 = 0;
  local_8d0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffbf58);
  local_8c8 = 0;
  local_8c7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffbfd4,in_stack_ffffffffffffbfd0),
                 in_stack_ffffffffffffbfc8,in_stack_ffffffffffffbfc4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffbfbf,in_stack_ffffffffffffbfb8),
                 in_stack_ffffffffffffbfb0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  local_38d0 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffbf68,&in_stack_ffffffffffffbf60->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  local_38f8 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffbf68,&in_stack_ffffffffffffbf60->typ);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbfa0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70),
                 (char *)in_stack_ffffffffffffbf68);
  local_bb8 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70));
  local_b90 = 0;
  uStack_b88 = 0;
  local_b80 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffbf58);
  local_b78 = 0;
  local_b77 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffbfd4,in_stack_ffffffffffffbfd0),
                 in_stack_ffffffffffffbfc8,in_stack_ffffffffffffbfc4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffbfbf,in_stack_ffffffffffffbfb8),
                 in_stack_ffffffffffffbfb0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8));
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffbf58);
  __l._M_len._0_7_ = in_stack_ffffffffffffbfa8;
  __l._M_array = (iterator)in_stack_ffffffffffffbfa0;
  __l._M_len._7_1_ = in_stack_ffffffffffffbfaf;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffbf98,__l,
             (allocator_type *)in_stack_ffffffffffffbf90);
  local_c00[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70));
  local_bd8 = 0;
  uStack_bd0 = 0;
  local_bc8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffbf58);
  local_bc0 = 0;
  local_bbf = 0;
  paVar2 = local_c00;
  RPCArg::RPCArg(in_stack_ffffffffffffbfe0,
                 (string *)CONCAT44(in_stack_ffffffffffffbfdc,in_stack_ffffffffffffbfd8),
                 in_stack_ffffffffffffbfd4,(Fallback *)in_stack_ffffffffffffbfc8,
                 (string *)CONCAT44(in_stack_ffffffffffffbfc4,in_stack_ffffffffffffbfc0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffbfbf,in_stack_ffffffffffffbfb8),opts);
  std::allocator<RPCArg>::allocator(paVar2);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffbfa8;
  __l_00._M_array = (iterator)in_stack_ffffffffffffbfa0;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffbfaf;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffbf98,__l_00,
             (allocator_type *)in_stack_ffffffffffffbf90);
  local_c48[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70));
  local_c20 = 0;
  uStack_c18 = 0;
  local_c10 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_c08 = 0;
  local_c07 = 0;
  paVar2 = local_c48;
  RPCArg::RPCArg(in_stack_ffffffffffffbfe0,
                 (string *)CONCAT44(in_stack_ffffffffffffbfdc,in_stack_ffffffffffffbfd8),
                 in_stack_ffffffffffffbfd4,(Fallback *)in_stack_ffffffffffffbfc8,
                 (string *)CONCAT44(in_stack_ffffffffffffbfc4,in_stack_ffffffffffffbfc0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffbfbf,in_stack_ffffffffffffbfb8),opts);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffbf68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffbf60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  local_d50 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70));
  local_d28 = 0;
  uStack_d20 = 0;
  local_d18 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_d10 = 0;
  local_d0f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffbfd4,in_stack_ffffffffffffbfd0),
                 in_stack_ffffffffffffbfc8,in_stack_ffffffffffffbfc4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffbfbf,in_stack_ffffffffffffbfb8),
                 in_stack_ffffffffffffbfb0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  UniValue::UniValue<const_char_(&)[6],_char[6],_true>
            (in_stack_ffffffffffffbfa0,(char (*) [6])in_stack_ffffffffffffbf98);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffbf68,in_stack_ffffffffffffbf60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  common::FeeModesDetail((string *)CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70),
                 in_stack_ffffffffffffbf68);
  local_ed0 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70));
  local_ea8 = 0;
  uStack_ea0 = 0;
  local_e98 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_e90 = 0;
  local_e8f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffbfd4,in_stack_ffffffffffffbfd0),
                 in_stack_ffffffffffffbfc8,in_stack_ffffffffffffbfc4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffbfbf,in_stack_ffffffffffffbfb8),
                 in_stack_ffffffffffffbfb0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffbf68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffbf60);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbfa0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70),
                 (char *)in_stack_ffffffffffffbf68);
  local_ff8 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70));
  local_fd0 = 0;
  uStack_fc8 = 0;
  local_fc0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_fb8 = 0;
  local_fb7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffbfd4,in_stack_ffffffffffffbfd0),
                 in_stack_ffffffffffffbfc8,in_stack_ffffffffffffbfc4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffbfbf,in_stack_ffffffffffffbfb8),
                 in_stack_ffffffffffffbfb0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  local_3908 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffbf68,&in_stack_ffffffffffffbf60->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  local_3942 = 1;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffbf98,(bool *)in_stack_ffffffffffffbf90);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffbf68,in_stack_ffffffffffffbf60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  local_1c28 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70));
  local_1c00 = 0;
  uStack_1bf8 = 0;
  local_1bf0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_1be8 = 0;
  local_1be7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffbfd4,in_stack_ffffffffffffbfd0),
                 in_stack_ffffffffffffbfc8,in_stack_ffffffffffffbfc4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffbfbf,in_stack_ffffffffffffbfb8),
                 in_stack_ffffffffffffbfb0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffbf68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffbf60);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbfa0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70),
                 (char *)in_stack_ffffffffffffbf68);
  local_1d50 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70));
  local_1d28 = 0;
  uStack_1d20 = 0;
  local_1d18 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_1d10 = 0;
  local_1d0f = 1;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffbfd4,in_stack_ffffffffffffbfd0),
                 in_stack_ffffffffffffbfc8,in_stack_ffffffffffffbfc4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffbfbf,in_stack_ffffffffffffbfb8),
                 in_stack_ffffffffffffbfb0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffbf68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffbf60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  local_1e58 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70));
  local_1e30 = 0;
  uStack_1e28 = 0;
  local_1e20 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_1e18 = 0;
  local_1e17 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffbfd4,in_stack_ffffffffffffbfd0),
                 in_stack_ffffffffffffbfc8,in_stack_ffffffffffffbfc4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffbfbf,in_stack_ffffffffffffbfb8),
                 in_stack_ffffffffffffbfb0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70));
  UniValue::UniValue(in_stack_ffffffffffffbf78,in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf68);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffbf68,in_stack_ffffffffffffbf60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  local_3970 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffbf68,&in_stack_ffffffffffffbf60->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  local_3998 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffbf68,&in_stack_ffffffffffffbf60->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  local_2518 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70));
  local_24f0 = 0;
  uStack_24e8 = 0;
  local_24e0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_24d8 = 0;
  local_24d7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffbfd4,in_stack_ffffffffffffbfd0),
                 in_stack_ffffffffffffbfc8,in_stack_ffffffffffffbfc4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffbfbf,in_stack_ffffffffffffbfb8),
                 in_stack_ffffffffffffbfb0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  local_39a0 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffbf68,&in_stack_ffffffffffffbf60->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  local_2600 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70));
  local_25d8 = 0;
  uStack_25d0 = 0;
  local_25c8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_25c0 = 0;
  local_25bf = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffbfd4,in_stack_ffffffffffffbfd0),
                 in_stack_ffffffffffffbfc8,in_stack_ffffffffffffbfc4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffbfbf,in_stack_ffffffffffffbfb8),
                 in_stack_ffffffffffffbfb0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffbf68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffbf60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  local_2708 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70));
  local_26e0 = 0;
  uStack_26d8 = 0;
  local_26d0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_26c8 = 0;
  local_26c7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffbfd4,in_stack_ffffffffffffbfd0),
                 in_stack_ffffffffffffbfc8,in_stack_ffffffffffffbfc4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffbfbf,in_stack_ffffffffffffbfb8),
                 in_stack_ffffffffffffbfb0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8));
  std::allocator<RPCArg>::allocator(paVar2);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffbfa8;
  __l_01._M_array = (iterator)in_stack_ffffffffffffbfa0;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffbfaf;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffbf98,__l_01,
             (allocator_type *)in_stack_ffffffffffffbf90);
  local_2750[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70));
  local_2728 = 0;
  uStack_2720 = 0;
  local_2718 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_2710 = 0;
  local_270f = 0;
  paVar2 = local_2750;
  RPCArg::RPCArg(in_stack_ffffffffffffbfe0,
                 (string *)CONCAT44(in_stack_ffffffffffffbfdc,in_stack_ffffffffffffbfd8),
                 in_stack_ffffffffffffbfd4,(Fallback *)in_stack_ffffffffffffbfc8,
                 (string *)CONCAT44(in_stack_ffffffffffffbfc4,in_stack_ffffffffffffbfc0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffbfbf,in_stack_ffffffffffffbfb8),opts);
  std::allocator<RPCArg>::allocator(paVar2);
  __l_02._M_len._0_7_ = in_stack_ffffffffffffbfa8;
  __l_02._M_array = (iterator)in_stack_ffffffffffffbfa0;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffbfaf;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffbf98,__l_02,
             (allocator_type *)in_stack_ffffffffffffbf90);
  local_2798[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70));
  local_2770 = 0;
  uStack_2768 = 0;
  local_2760 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_2758 = 0;
  local_2757 = 0;
  paVar2 = local_2798;
  RPCArg::RPCArg(in_stack_ffffffffffffbfe0,
                 (string *)CONCAT44(in_stack_ffffffffffffbfdc,in_stack_ffffffffffffbfd8),
                 in_stack_ffffffffffffbfd4,(Fallback *)in_stack_ffffffffffffbfc8,
                 (string *)CONCAT44(in_stack_ffffffffffffbfc4,in_stack_ffffffffffffbfc0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffbfbf,in_stack_ffffffffffffbfb8),opts);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  local_39ac = 0;
  UniValue::UniValue<int,_int,_true>(in_stack_ffffffffffffbf98,(int *)in_stack_ffffffffffffbf90);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffbf68,in_stack_ffffffffffffbf60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  local_28d8 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70));
  local_28b0 = 0;
  uStack_28a8 = 0;
  local_28a0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_2898 = 0;
  local_2897 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffbfd4,in_stack_ffffffffffffbfd0),
                 in_stack_ffffffffffffbfc8,in_stack_ffffffffffffbfc4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffbfbf,in_stack_ffffffffffffbfb8),
                 in_stack_ffffffffffffbfb0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  local_39af = 0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffbf98,(bool *)in_stack_ffffffffffffbf90);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffbf68,in_stack_ffffffffffffbf60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  local_2a18 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70));
  local_29f0 = 0;
  uStack_29e8 = 0;
  local_29e0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_29d8 = 0;
  local_29d7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffbfd4,in_stack_ffffffffffffbfd0),
                 in_stack_ffffffffffffbfc8,in_stack_ffffffffffffbfc4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffbfbf,in_stack_ffffffffffffbfb8),
                 in_stack_ffffffffffffbfb0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffbf68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffbf60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  local_2b20 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70));
  local_2af8 = 0;
  uStack_2af0 = 0;
  local_2ae8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_2ae0 = 0;
  local_2adf = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffbfd4,in_stack_ffffffffffffbfd0),
                 in_stack_ffffffffffffbfc8,in_stack_ffffffffffffbfc4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffbfbf,in_stack_ffffffffffffbfb8),
                 in_stack_ffffffffffffbfb0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  local_39b5 = 0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffbf98,(bool *)in_stack_ffffffffffffbf90);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffbf68,in_stack_ffffffffffffbf60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  local_2c60 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70));
  local_2c38 = 0;
  uStack_2c30 = 0;
  local_2c28 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_2c20 = 0;
  local_2c1f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffbfd4,in_stack_ffffffffffffbfd0),
                 in_stack_ffffffffffffbfc8,in_stack_ffffffffffffbfc4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffbfbf,in_stack_ffffffffffffbfb8),
                 in_stack_ffffffffffffbfb0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  local_39bc = 0;
  UniValue::UniValue<int,_int,_true>(in_stack_ffffffffffffbf98,(int *)in_stack_ffffffffffffbf90);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffbf68,in_stack_ffffffffffffbf60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  local_2da0 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70));
  local_2d78 = 0;
  uStack_2d70 = 0;
  local_2d68 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_2d60 = 0;
  local_2d5f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffbfd4,in_stack_ffffffffffffbfd0),
                 in_stack_ffffffffffffbfc8,in_stack_ffffffffffffbfc4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffbfbf,in_stack_ffffffffffffbfb8),
                 in_stack_ffffffffffffbfb0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  local_39c4 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffbf68,&in_stack_ffffffffffffbf60->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  local_2e88 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70));
  local_2e60 = 0;
  uStack_2e58 = 0;
  local_2e50 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_2e48 = 0;
  local_2e47 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffbfd4,in_stack_ffffffffffffbfd0),
                 in_stack_ffffffffffffbfc8,in_stack_ffffffffffffbfc4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffbfbf,in_stack_ffffffffffffbfb8),
                 in_stack_ffffffffffffbfb0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8));
  std::allocator<RPCArg>::allocator(paVar2);
  __l_03._M_len._0_7_ = in_stack_ffffffffffffbfa8;
  __l_03._M_array = (iterator)in_stack_ffffffffffffbfa0;
  __l_03._M_len._7_1_ = in_stack_ffffffffffffbfaf;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffbf98,__l_03,
             (allocator_type *)in_stack_ffffffffffffbf90);
  FundTxDoc(&local_39e0,true);
  Cat<std::vector<RPCArg,std::allocator<RPCArg>>>
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffbf90,
             (vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffbf88);
  local_2ed0[0] = (allocator<RPCArg>)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  local_2ea8 = 0;
  uStack_2ea0 = 0;
  local_2e98 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_2e90 = 0;
  local_2e8f = 0;
  paVar2 = local_2ed0;
  RPCArg::RPCArg(in_stack_ffffffffffffbfe0,
                 (string *)CONCAT44(in_stack_ffffffffffffbfdc,in_stack_ffffffffffffbfd8),
                 in_stack_ffffffffffffbfd4,(Fallback *)in_stack_ffffffffffffbfc8,
                 (string *)CONCAT44(in_stack_ffffffffffffbfc4,in_stack_ffffffffffffbfc0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffbfbf,in_stack_ffffffffffffbfb8),opts);
  std::allocator<RPCArg>::allocator(paVar2);
  __l_04._M_len._0_7_ = in_stack_ffffffffffffbfa8;
  __l_04._M_array = (iterator)in_stack_ffffffffffffbfa0;
  __l_04._M_len._7_1_ = in_stack_ffffffffffffbfaf;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffbf98,__l_04,
             (allocator_type *)in_stack_ffffffffffffbf90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  local_3a49.super__Function_base._M_functor._1_8_ = 0;
  local_3a49.super__Function_base._9_8_ = 0;
  local_3a49._17_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbfe0,in_stack_ffffffffffffbfdc,
             (string *)CONCAT44(in_stack_ffffffffffffbfd4,in_stack_ffffffffffffbfd0),
             in_stack_ffffffffffffbfc8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbfc4,in_stack_ffffffffffffbfc0),
             (bool)in_stack_ffffffffffffbfbf);
  fun = &local_3a49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  local_3a69[1] = (allocator<char>)0x0;
  local_3a69[2] = (allocator<char>)0x0;
  local_3a69[3] = (allocator<char>)0x0;
  local_3a69[4] = (allocator<char>)0x0;
  local_3a69[5] = (allocator<char>)0x0;
  local_3a69[6] = (allocator<char>)0x0;
  local_3a69[7] = (allocator<char>)0x0;
  local_3a69[8] = (allocator<char>)0x0;
  local_3a69[9] = (allocator<char>)0x0;
  local_3a69[10] = (allocator<char>)0x0;
  local_3a69[0xb] = (allocator<char>)0x0;
  local_3a69[0xc] = (allocator<char>)0x0;
  local_3a69[0xd] = (allocator<char>)0x0;
  local_3a69[0xe] = (allocator<char>)0x0;
  local_3a69[0xf] = (allocator<char>)0x0;
  local_3a69[0x10] = (allocator<char>)0x0;
  local_3a69[0x11] = (allocator<char>)0x0;
  local_3a69[0x12] = (allocator<char>)0x0;
  local_3a69[0x13] = (allocator<char>)0x0;
  local_3a69[0x14] = (allocator<char>)0x0;
  local_3a69[0x15] = (allocator<char>)0x0;
  local_3a69[0x16] = (allocator<char>)0x0;
  local_3a69[0x17] = (allocator<char>)0x0;
  local_3a69[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  pvVar3 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)paVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffbfdc,in_stack_ffffffffffffbfd8),
             in_stack_ffffffffffffbfd4,in_stack_ffffffffffffbfc8,
             SUB41(in_stack_ffffffffffffbfc4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffbfbf,in_stack_ffffffffffffbfb8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbfb0,
             (bool)in_stack_ffffffffffffbfaf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  local_3a89[1] = (allocator<char>)0x0;
  local_3a89[2] = (allocator<char>)0x0;
  local_3a89[3] = (allocator<char>)0x0;
  local_3a89[4] = (allocator<char>)0x0;
  local_3a89[5] = (allocator<char>)0x0;
  local_3a89[6] = (allocator<char>)0x0;
  local_3a89[7] = (allocator<char>)0x0;
  local_3a89[8] = (allocator<char>)0x0;
  local_3a89[9] = (allocator<char>)0x0;
  local_3a89[10] = (allocator<char>)0x0;
  local_3a89[0xb] = (allocator<char>)0x0;
  local_3a89[0xc] = (allocator<char>)0x0;
  local_3a89[0xd] = (allocator<char>)0x0;
  local_3a89[0xe] = (allocator<char>)0x0;
  local_3a89[0xf] = (allocator<char>)0x0;
  local_3a89[0x10] = (allocator<char>)0x0;
  local_3a89[0x11] = (allocator<char>)0x0;
  local_3a89[0x12] = (allocator<char>)0x0;
  local_3a89[0x13] = (allocator<char>)0x0;
  local_3a89[0x14] = (allocator<char>)0x0;
  local_3a89[0x15] = (allocator<char>)0x0;
  local_3a89[0x16] = (allocator<char>)0x0;
  local_3a89[0x17] = (allocator<char>)0x0;
  local_3a89[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  pvVar3 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffbfdc,in_stack_ffffffffffffbfd8),
             in_stack_ffffffffffffbfd4,in_stack_ffffffffffffbfc8,
             SUB41(in_stack_ffffffffffffbfc4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffbfbf,in_stack_ffffffffffffbfb8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbfb0,
             (bool)in_stack_ffffffffffffbfaf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  local_3aa8 = (pointer)0x0;
  pRStack_3aa0 = (pointer)0x0;
  local_3a98 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  this = (allocator<RPCResult> *)((ulong)pvVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffbfdc,in_stack_ffffffffffffbfd8),
             in_stack_ffffffffffffbfd4,in_stack_ffffffffffffbfc8,
             SUB41(in_stack_ffffffffffffbfc4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffbfbf,in_stack_ffffffffffffbfb8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbfb0,
             (bool)in_stack_ffffffffffffbfaf);
  std::allocator<RPCResult>::allocator(this);
  __l_05._M_len._0_7_ = in_stack_ffffffffffffbfa8;
  __l_05._M_array = (iterator)in_stack_ffffffffffffbfa0;
  __l_05._M_len._7_1_ = in_stack_ffffffffffffbfaf;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbf98,__l_05,
             (allocator_type *)in_stack_ffffffffffffbf90);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbfe0,in_stack_ffffffffffffbfdc,
             (string *)CONCAT44(in_stack_ffffffffffffbfd4,in_stack_ffffffffffffbfd0),
             in_stack_ffffffffffffbfc8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbfc4,in_stack_ffffffffffffbfc0),
             (bool)in_stack_ffffffffffffbfbf);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffbfdc,in_stack_ffffffffffffbfd8),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffbfd4,in_stack_ffffffffffffbfd0));
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbfa0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70),
                 (char *)in_stack_ffffffffffffbf68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbfa0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70),
                 (char *)in_stack_ffffffffffffbf68);
  HelpExampleCli(in_stack_ffffffffffffbf90,in_stack_ffffffffffffbf88);
  std::operator+(in_stack_ffffffffffffbf90,in_stack_ffffffffffffbf88);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70),
                 (char *)in_stack_ffffffffffffbf68);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70),
                 in_stack_ffffffffffffbf68);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70),
                 (char *)in_stack_ffffffffffffbf68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbfa0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70),
                 (char *)in_stack_ffffffffffffbf68);
  HelpExampleCli(in_stack_ffffffffffffbf90,in_stack_ffffffffffffbf88);
  std::operator+(in_stack_ffffffffffffbf90,in_stack_ffffffffffffbf88);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70),
                 (char *)in_stack_ffffffffffffbf68);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70),
                 in_stack_ffffffffffffbf68);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70),
                 (char *)in_stack_ffffffffffffbf68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbfa0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70),
                 (char *)in_stack_ffffffffffffbf68);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70),
                 in_stack_ffffffffffffbf68);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70),
                 (char *)in_stack_ffffffffffffbf68);
  HelpExampleCli(in_stack_ffffffffffffbf90,in_stack_ffffffffffffbf88);
  std::operator+(in_stack_ffffffffffffbf90,in_stack_ffffffffffffbf88);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70),
                 (char *)in_stack_ffffffffffffbf68);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70),
                 in_stack_ffffffffffffbf68);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70),
                 (char *)in_stack_ffffffffffffbf68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbfa0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70),
                 (char *)in_stack_ffffffffffffbf68);
  HelpExampleCli(in_stack_ffffffffffffbf90,in_stack_ffffffffffffbf88);
  std::operator+(in_stack_ffffffffffffbf90,in_stack_ffffffffffffbf88);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70),
                 (char *)in_stack_ffffffffffffbf68);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70),
                 in_stack_ffffffffffffbf68);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70),
                 (char *)in_stack_ffffffffffffbf68);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70),
                 in_stack_ffffffffffffbf68);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70),
                 (char *)in_stack_ffffffffffffbf68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
             (char *)in_stack_ffffffffffffbfa0,(allocator<char> *)in_stack_ffffffffffffbf98);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffbfaf,in_stack_ffffffffffffbfa8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbfa0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70),
                 (char *)in_stack_ffffffffffffbf68);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70),
                 in_stack_ffffffffffffbf68);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffbf74,in_stack_ffffffffffffbf70),
                 (char *)in_stack_ffffffffffffbf68);
  HelpExampleCli(in_stack_ffffffffffffbf90,in_stack_ffffffffffffbf88);
  std::operator+(in_stack_ffffffffffffbf90,in_stack_ffffffffffffbf88);
  RPCExamples::RPCExamples((RPCExamples *)this,(string *)0x57f9de);
  this_00 = (RPCArg *)local_3ad0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::sendall()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_ffffffffffffbf68,(anon_class_1_0_00000001 *)in_stack_ffffffffffffbf60);
  RPCHelpMan::RPCHelpMan
            (in_stack_ffffffffffffc0c8,in_stack_ffffffffffffc0c0,in_stack_ffffffffffffc0b8,
             in_stack_ffffffffffffc0b0,in_stack_ffffffffffffc0a8,in_stack_ffffffffffffc0a0,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_3ad0 + 0x22));
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3aad);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3aac);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3aab);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_3aaa);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  RPCResults::~RPCResults((RPCResults *)this_00);
  RPCResult::~RPCResult((RPCResult *)this_00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbf68);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_3ed8 = local_2f98;
  do {
    local_3ed8 = local_3ed8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_3ed8 != local_31b8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbf68);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3a8a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_3a89);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbf68);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3a6a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_3a69);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbf68);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3a4a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a49);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbf68);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3a22);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_3a21);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3a02);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_3a01);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffbf68);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_3ef0 = local_48;
  do {
    local_3ef0 = local_3ef0 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_3ef0 != local_570);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::allocator<char>::~allocator(&local_39e1);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffbf68);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffbf68);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffbf68);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_3f08 = local_1098;
  do {
    local_3f08 = local_3f08 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_3f08 != local_1ae8);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_39c5);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_39be);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_39bd);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_39b7);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_39b6);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_39b4);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_39b3);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_39b2);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_39b1);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_39b0);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_39ae);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_39ad);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_39a7);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffbf68);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_3f20 = local_1f70;
  do {
    local_3f20 = local_3f20 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_3f20 != local_2078);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffbf68);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  puVar4 = local_2430;
  puVar1 = local_2118;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (puVar1 != puVar4);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_39a4);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_39a3);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_39a2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_39a1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_399a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3999);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_3991);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3971);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_3969);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_394a);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3949);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3948);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3947);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3946);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3945);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3944);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3943);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_3941);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3909);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3902);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3901);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3900);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_38ff);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_38fe);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_38fd);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_38fc);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_38fb);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffbf68);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  puVar4 = local_820;
  puVar1 = local_610;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (puVar1 != puVar4);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffbf68);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_3f68 = local_9a8;
  do {
    local_3f68 = local_3f68 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_3f68 != local_ab0);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_38f1);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_38d1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_38ca);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_38c9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_38c1);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_38a1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_3899);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_387a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_3879);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan sendall()
{
    return RPCHelpMan{"sendall",
        "EXPERIMENTAL warning: this call may be changed in future releases.\n"
        "\nSpend the value of all (or specific) confirmed UTXOs and unconfirmed change in the wallet to one or more recipients.\n"
        "Unconfirmed inbound UTXOs and locked UTXOs will not be spent. Sendall will respect the avoid_reuse wallet flag.\n"
        "If your wallet contains many small inputs, either because it received tiny payments or as a result of accumulating change, consider using `send_max` to exclude inputs that are worth less than the fees needed to spend them.\n",
        {
            {"recipients", RPCArg::Type::ARR, RPCArg::Optional::NO, "The sendall destinations. Each address may only appear once.\n"
                "Optionally some recipients can be specified with an amount to perform payments, but at least one address must appear without a specified amount.\n",
                {
                    {"address", RPCArg::Type::STR, RPCArg::Optional::NO, "A bitcoin address which receives an equal share of the unspecified amount."},
                    {"", RPCArg::Type::OBJ_USER_KEYS, RPCArg::Optional::OMITTED, "",
                        {
                            {"address", RPCArg::Type::AMOUNT, RPCArg::Optional::NO, "A key-value pair. The key (string) is the bitcoin address, the value (float or string) is the amount in " + CURRENCY_UNIT + ""},
                        },
                    },
                },
            },
            {"conf_target", RPCArg::Type::NUM, RPCArg::DefaultHint{"wallet -txconfirmtarget"}, "Confirmation target in blocks"},
            {"estimate_mode", RPCArg::Type::STR, RPCArg::Default{"unset"}, "The fee estimate mode, must be one of (case insensitive):\n"
              + FeeModesDetail(std::string("economical mode is used if the transaction is replaceable;\notherwise, conservative mode is used"))},
            {"fee_rate", RPCArg::Type::AMOUNT, RPCArg::DefaultHint{"not set, fall back to wallet fee estimation"}, "Specify a fee rate in " + CURRENCY_ATOM + "/vB."},
            {
                "options", RPCArg::Type::OBJ_NAMED_PARAMS, RPCArg::Optional::OMITTED, "",
                Cat<std::vector<RPCArg>>(
                    {
                        {"add_to_wallet", RPCArg::Type::BOOL, RPCArg::Default{true}, "When false, returns the serialized transaction without broadcasting or adding it to the wallet"},
                        {"fee_rate", RPCArg::Type::AMOUNT, RPCArg::DefaultHint{"not set, fall back to wallet fee estimation"}, "Specify a fee rate in " + CURRENCY_ATOM + "/vB.", RPCArgOptions{.also_positional = true}},
                        {"include_watching", RPCArg::Type::BOOL, RPCArg::DefaultHint{"true for watch-only wallets, otherwise false"}, "Also select inputs which are watch-only.\n"
                                              "Only solvable inputs can be used. Watch-only destinations are solvable if the public key and/or output script was imported,\n"
                                              "e.g. with 'importpubkey' or 'importmulti' with the 'pubkeys' or 'desc' field."},
                        {"inputs", RPCArg::Type::ARR, RPCArg::Default{UniValue::VARR}, "Use exactly the specified inputs to build the transaction. Specifying inputs is incompatible with the send_max, minconf, and maxconf options.",
                            {
                                {"", RPCArg::Type::OBJ, RPCArg::Optional::OMITTED, "",
                                    {
                                        {"txid", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The transaction id"},
                                        {"vout", RPCArg::Type::NUM, RPCArg::Optional::NO, "The output number"},
                                        {"sequence", RPCArg::Type::NUM, RPCArg::DefaultHint{"depends on the value of the 'replaceable' and 'locktime' arguments"}, "The sequence number"},
                                    },
                                },
                            },
                        },
                        {"locktime", RPCArg::Type::NUM, RPCArg::Default{0}, "Raw locktime. Non-0 value also locktime-activates inputs"},
                        {"lock_unspents", RPCArg::Type::BOOL, RPCArg::Default{false}, "Lock selected unspent outputs"},
                        {"psbt", RPCArg::Type::BOOL,  RPCArg::DefaultHint{"automatic"}, "Always return a PSBT, implies add_to_wallet=false."},
                        {"send_max", RPCArg::Type::BOOL, RPCArg::Default{false}, "When true, only use UTXOs that can pay for their own fees to maximize the output amount. When 'false' (default), no UTXO is left behind. send_max is incompatible with providing specific inputs."},
                        {"minconf", RPCArg::Type::NUM, RPCArg::Default{0}, "Require inputs with at least this many confirmations."},
                        {"maxconf", RPCArg::Type::NUM, RPCArg::Optional::OMITTED, "Require inputs with at most this many confirmations."},
                    },
                    FundTxDoc()
                ),
                RPCArgOptions{.oneline_description="options"}
            },
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "",
                {
                    {RPCResult::Type::BOOL, "complete", "If the transaction has a complete set of signatures"},
                    {RPCResult::Type::STR_HEX, "txid", /*optional=*/true, "The transaction id for the send. Only 1 transaction is created regardless of the number of addresses."},
                    {RPCResult::Type::STR_HEX, "hex", /*optional=*/true, "If add_to_wallet is false, the hex-encoded raw transaction with signature(s)"},
                    {RPCResult::Type::STR, "psbt", /*optional=*/true, "If more signatures are needed, or if add_to_wallet is false, the base64-encoded (partially) signed transaction"}
                }
        },
        RPCExamples{""
        "\nSpend all UTXOs from the wallet with a fee rate of 1 " + CURRENCY_ATOM + "/vB using named arguments\n"
        + HelpExampleCli("-named sendall", "recipients='[\"" + EXAMPLE_ADDRESS[0] + "\"]' fee_rate=1\n") +
        "Spend all UTXOs with a fee rate of 1.1 " + CURRENCY_ATOM + "/vB using positional arguments\n"
        + HelpExampleCli("sendall", "'[\"" + EXAMPLE_ADDRESS[0] + "\"]' null \"unset\" 1.1\n") +
        "Spend all UTXOs split into equal amounts to two addresses with a fee rate of 1.5 " + CURRENCY_ATOM + "/vB using the options argument\n"
        + HelpExampleCli("sendall", "'[\"" + EXAMPLE_ADDRESS[0] + "\", \"" + EXAMPLE_ADDRESS[1] + "\"]' null \"unset\" null '{\"fee_rate\": 1.5}'\n") +
        "Leave dust UTXOs in wallet, spend only UTXOs with positive effective value with a fee rate of 10 " + CURRENCY_ATOM + "/vB using the options argument\n"
        + HelpExampleCli("sendall", "'[\"" + EXAMPLE_ADDRESS[0] + "\"]' null \"unset\" null '{\"fee_rate\": 10, \"send_max\": true}'\n") +
        "Spend all UTXOs with a fee rate of 1.3 " + CURRENCY_ATOM + "/vB using named arguments and sending a 0.25 " + CURRENCY_UNIT + " to another recipient\n"
        + HelpExampleCli("-named sendall", "recipients='[{\"" + EXAMPLE_ADDRESS[1] + "\": 0.25}, \""+ EXAMPLE_ADDRESS[0] + "\"]' fee_rate=1.3\n")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            std::shared_ptr<CWallet> const pwallet{GetWalletForJSONRPCRequest(request)};
            if (!pwallet) return UniValue::VNULL;
            // Make sure the results are valid at least up to the most recent block
            // the user could have gotten from another RPC command prior to now
            pwallet->BlockUntilSyncedToCurrentChain();

            UniValue options{request.params[4].isNull() ? UniValue::VOBJ : request.params[4]};
            InterpretFeeEstimationInstructions(/*conf_target=*/request.params[1], /*estimate_mode=*/request.params[2], /*fee_rate=*/request.params[3], options);
            PreventOutdatedOptions(options);


            std::set<std::string> addresses_without_amount;
            UniValue recipient_key_value_pairs(UniValue::VARR);
            const UniValue& recipients{request.params[0]};
            for (unsigned int i = 0; i < recipients.size(); ++i) {
                const UniValue& recipient{recipients[i]};
                if (recipient.isStr()) {
                    UniValue rkvp(UniValue::VOBJ);
                    rkvp.pushKV(recipient.get_str(), 0);
                    recipient_key_value_pairs.push_back(std::move(rkvp));
                    addresses_without_amount.insert(recipient.get_str());
                } else {
                    recipient_key_value_pairs.push_back(recipient);
                }
            }

            if (addresses_without_amount.size() == 0) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Must provide at least one address without a specified amount");
            }

            CCoinControl coin_control;

            SetFeeEstimateMode(*pwallet, coin_control, options["conf_target"], options["estimate_mode"], options["fee_rate"], /*override_min_fee=*/false);

            coin_control.fAllowWatchOnly = ParseIncludeWatchonly(options["include_watching"], *pwallet);

            if (options.exists("minconf")) {
                if (options["minconf"].getInt<int>() < 0)
                {
                    throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Invalid minconf (minconf cannot be negative): %s", options["minconf"].getInt<int>()));
                }

                coin_control.m_min_depth = options["minconf"].getInt<int>();
            }

            if (options.exists("maxconf")) {
                coin_control.m_max_depth = options["maxconf"].getInt<int>();

                if (coin_control.m_max_depth < coin_control.m_min_depth) {
                    throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("maxconf can't be lower than minconf: %d < %d", coin_control.m_max_depth, coin_control.m_min_depth));
                }
            }

            const bool rbf{options.exists("replaceable") ? options["replaceable"].get_bool() : pwallet->m_signal_rbf};

            FeeCalculation fee_calc_out;
            CFeeRate fee_rate{GetMinimumFeeRate(*pwallet, coin_control, &fee_calc_out)};
            // Do not, ever, assume that it's fine to change the fee rate if the user has explicitly
            // provided one
            if (coin_control.m_feerate && fee_rate > *coin_control.m_feerate) {
               throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Fee rate (%s) is lower than the minimum fee rate setting (%s)", coin_control.m_feerate->ToString(FeeEstimateMode::SAT_VB), fee_rate.ToString(FeeEstimateMode::SAT_VB)));
            }
            if (fee_calc_out.reason == FeeReason::FALLBACK && !pwallet->m_allow_fallback_fee) {
                // eventually allow a fallback fee
                throw JSONRPCError(RPC_WALLET_ERROR, "Fee estimation failed. Fallbackfee is disabled. Wait a few blocks or enable -fallbackfee.");
            }

            CMutableTransaction rawTx{ConstructTransaction(options["inputs"], recipient_key_value_pairs, options["locktime"], rbf)};
            LOCK(pwallet->cs_wallet);

            CAmount total_input_value(0);
            bool send_max{options.exists("send_max") ? options["send_max"].get_bool() : false};
            if (options.exists("inputs") && options.exists("send_max")) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Cannot combine send_max with specific inputs.");
            } else if (options.exists("inputs") && (options.exists("minconf") || options.exists("maxconf"))) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Cannot combine minconf or maxconf with specific inputs.");
            } else if (options.exists("inputs")) {
                for (const CTxIn& input : rawTx.vin) {
                    if (pwallet->IsSpent(input.prevout)) {
                        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Input not available. UTXO (%s:%d) was already spent.", input.prevout.hash.ToString(), input.prevout.n));
                    }
                    const CWalletTx* tx{pwallet->GetWalletTx(input.prevout.hash)};
                    if (!tx || input.prevout.n >= tx->tx->vout.size() || !(pwallet->IsMine(tx->tx->vout[input.prevout.n]) & (coin_control.fAllowWatchOnly ? ISMINE_ALL : ISMINE_SPENDABLE))) {
                        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Input not found. UTXO (%s:%d) is not part of wallet.", input.prevout.hash.ToString(), input.prevout.n));
                    }
                    total_input_value += tx->tx->vout[input.prevout.n].nValue;
                }
            } else {
                CoinFilterParams coins_params;
                coins_params.min_amount = 0;
                for (const COutput& output : AvailableCoins(*pwallet, &coin_control, fee_rate, coins_params).All()) {
                    CHECK_NONFATAL(output.input_bytes > 0);
                    if (send_max && fee_rate.GetFee(output.input_bytes) > output.txout.nValue) {
                        continue;
                    }
                    CTxIn input(output.outpoint.hash, output.outpoint.n, CScript(), rbf ? MAX_BIP125_RBF_SEQUENCE : CTxIn::SEQUENCE_FINAL);
                    rawTx.vin.push_back(input);
                    total_input_value += output.txout.nValue;
                }
            }

            std::vector<COutPoint> outpoints_spent;
            outpoints_spent.reserve(rawTx.vin.size());

            for (const CTxIn& tx_in : rawTx.vin) {
                outpoints_spent.push_back(tx_in.prevout);
            }

            // estimate final size of tx
            const TxSize tx_size{CalculateMaximumSignedTxSize(CTransaction(rawTx), pwallet.get())};
            const CAmount fee_from_size{fee_rate.GetFee(tx_size.vsize)};
            const std::optional<CAmount> total_bump_fees{pwallet->chain().calculateCombinedBumpFee(outpoints_spent, fee_rate)};
            CAmount effective_value = total_input_value - fee_from_size - total_bump_fees.value_or(0);

            if (fee_from_size > pwallet->m_default_max_tx_fee) {
                throw JSONRPCError(RPC_WALLET_ERROR, TransactionErrorString(TransactionError::MAX_FEE_EXCEEDED).original);
            }

            if (effective_value <= 0) {
                if (send_max) {
                    throw JSONRPCError(RPC_WALLET_INSUFFICIENT_FUNDS, "Total value of UTXO pool too low to pay for transaction, try using lower feerate.");
                } else {
                    throw JSONRPCError(RPC_WALLET_INSUFFICIENT_FUNDS, "Total value of UTXO pool too low to pay for transaction. Try using lower feerate or excluding uneconomic UTXOs with 'send_max' option.");
                }
            }

            // If this transaction is too large, e.g. because the wallet has many UTXOs, it will be rejected by the node's mempool.
            if (tx_size.weight > MAX_STANDARD_TX_WEIGHT) {
                throw JSONRPCError(RPC_WALLET_ERROR, "Transaction too large.");
            }

            CAmount output_amounts_claimed{0};
            for (const CTxOut& out : rawTx.vout) {
                output_amounts_claimed += out.nValue;
            }

            if (output_amounts_claimed > total_input_value) {
                throw JSONRPCError(RPC_WALLET_INSUFFICIENT_FUNDS, "Assigned more value to outputs than available funds.");
            }

            const CAmount remainder{effective_value - output_amounts_claimed};
            if (remainder < 0) {
                throw JSONRPCError(RPC_WALLET_INSUFFICIENT_FUNDS, "Insufficient funds for fees after creating specified outputs.");
            }

            const CAmount per_output_without_amount{remainder / (long)addresses_without_amount.size()};

            bool gave_remaining_to_first{false};
            for (CTxOut& out : rawTx.vout) {
                CTxDestination dest;
                ExtractDestination(out.scriptPubKey, dest);
                std::string addr{EncodeDestination(dest)};
                if (addresses_without_amount.count(addr) > 0) {
                    out.nValue = per_output_without_amount;
                    if (!gave_remaining_to_first) {
                        out.nValue += remainder % addresses_without_amount.size();
                        gave_remaining_to_first = true;
                    }
                    if (IsDust(out, pwallet->chain().relayDustFee())) {
                        // Dynamically generated output amount is dust
                        throw JSONRPCError(RPC_WALLET_INSUFFICIENT_FUNDS, "Dynamically assigned remainder results in dust output.");
                    }
                } else {
                    if (IsDust(out, pwallet->chain().relayDustFee())) {
                        // Specified output amount is dust
                        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Specified output amount to %s is below dust threshold.", addr));
                    }
                }
            }

            const bool lock_unspents{options.exists("lock_unspents") ? options["lock_unspents"].get_bool() : false};
            if (lock_unspents) {
                for (const CTxIn& txin : rawTx.vin) {
                    pwallet->LockCoin(txin.prevout);
                }
            }

            return FinishTransaction(pwallet, options, rawTx);
        }
    };
}